

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O3

QString * __thiscall
QXcbScreen::getName(QString *__return_storage_ptr__,QXcbScreen *this,
                   xcb_randr_monitor_info_t *monitorInfo)

{
  char *pcVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  long lVar6;
  char *pcVar7;
  storage_type *psVar8;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QArrayData *local_118;
  char16_t *pcStack_110;
  qsizetype local_108;
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QString local_d8;
  QByteArray local_b8;
  QByteArray local_98;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QXcbBasicConnection::atomName(&local_98,*(QXcbBasicConnection **)(this + 0x10),monitorInfo->name);
  if ((undefined1 *)local_98.d.size == (undefined1 *)0x0) {
    local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    pcVar7 = *(char **)(*(long *)(this + 0x10) + 0x20);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)&QByteArray::_empty;
    }
    QByteArray::QByteArray(&local_b8,pcVar7,-1);
    psVar8 = (storage_type *)local_b8.d.size;
    pcVar7 = local_b8.d.ptr;
    if ((local_b8.d.ptr != (char *)0x0) &&
       (lVar6 = qmemrchr(local_b8.d.ptr,0x2e,
                         (ulong)(local_b8.d.size +
                                (ulong)((storage_type *)local_b8.d.size == (storage_type *)0x0))),
       (-(uint)(lVar6 == 0) | (int)lVar6 - (int)pcVar7) != 0xffffffff)) {
      QByteArray::truncate((longlong)&local_b8);
      psVar8 = (storage_type *)local_b8.d.size;
    }
    QVar10.m_data = psVar8;
    QVar10.m_size = (qsizetype)&local_f8;
    QString::fromLocal8Bit(QVar10);
    qVar4 = local_e8;
    pcVar3 = pcStack_f0;
    pQVar2 = local_f8;
    local_e8 = 0;
    local_f8 = (QArrayData *)0x0;
    pcStack_f0 = (char16_t *)0x0;
    QString::number((int)&local_118,*(int *)(*(long *)(this + 0x20) + 0x10));
    local_78.b.d.size = local_108;
    local_78.b.d.ptr = pcStack_110;
    local_78.b.d.d = (Data *)local_118;
    local_78.a.a.d.d = (Data *)pQVar2;
    local_78.a.a.d.ptr = pcVar3;
    local_78.a.a.d.size = qVar4;
    local_78.a.b = L'.';
    local_118 = (QArrayData *)0x0;
    pcStack_110 = (char16_t *)0x0;
    local_108 = 0;
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
              (&local_d8,&local_78);
    pDVar5 = local_d8.d.d;
    local_d8.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr = local_d8.d.ptr;
    local_d8.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_d8.d.size;
    local_d8.d.size = 0;
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_78);
    if (local_118 != (QArrayData *)0x0) {
      LOCK();
      (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_118,2,0x10);
      }
    }
    if (local_f8 != (QArrayData *)0x0) {
      LOCK();
      (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f8,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    pcVar7 = local_98.d.ptr;
    if (local_98.d.ptr == (char *)0x0) {
      pcVar7 = (char *)&QByteArray::_empty;
    }
    psVar8 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = pcVar7 + 1 + (long)psVar8;
      psVar8 = psVar8 + 1;
    } while (*pcVar1 != '\0');
    QVar9.m_data = psVar8;
    QVar9.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar9);
    pDVar5 = local_78.a.a.d.d;
    local_78.a.a.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr = local_78.a.a.d.ptr;
    local_78.a.a.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_78.a.a.d.size;
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QXcbScreen::getName(xcb_randr_monitor_info_t *monitorInfo)
{
    QString name;
    QByteArray ba = connection()->atomName(monitorInfo->name);
    if (!ba.isEmpty()) {
        name = QString::fromLatin1(ba.constData());
    } else {
        QByteArray displayName = connection()->displayName();
        int dotPos = displayName.lastIndexOf('.');
        if (dotPos != -1)
            displayName.truncate(dotPos);
        name = QString::fromLocal8Bit(displayName) + u'.'
                + QString::number(m_virtualDesktop->number());
    }
    return name;
}